

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O1

bool __thiscall
bssl::anon_unknown_5::AESRecordNumberEncrypter::GenerateMask
          (AESRecordNumberEncrypter *this,Span<unsigned_char> out,Span<const_unsigned_char> sample)

{
  ulong __n;
  bool bVar1;
  uint8_t mask [16];
  uchar auStack_28 [16];
  
  __n = out.size_;
  bVar1 = 0xf < sample.size_;
  if (__n < 0x11 && bVar1) {
    AES_encrypt(sample.data_,auStack_28,(AES_KEY *)&this->key_);
    if (__n != 0) {
      memcpy(out.data_,auStack_28,__n);
    }
  }
  return __n < 0x11 && bVar1;
}

Assistant:

bool GenerateMask(Span<uint8_t> out, Span<const uint8_t> sample) override {
    if (sample.size() < AES_BLOCK_SIZE || out.size() > AES_BLOCK_SIZE) {
      return false;
    }
    uint8_t mask[AES_BLOCK_SIZE];
    AES_encrypt(sample.data(), mask, &key_);
    OPENSSL_memcpy(out.data(), mask, out.size());
    return true;
  }